

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

int main(void)

{
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  anon_class_1_0_00000001 local_349;
  functor_string local_348;
  allocator<char> local_311;
  string local_310;
  undefined1 local_2f0 [8];
  server_t s;
  
  clask::server();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"/api",&local_311);
  std::function<std::__cxx11::string(clask::request&)>::function<main::__0,void>
            ((function<std::__cxx11::string(clask::request&)> *)&local_348,&local_349);
  clask::server_t::GET((server_t *)local_2f0,&local_310,&local_348);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
  ::~function(&local_348);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"/",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"./public",&local_399);
  clask::server_t::static_dir((server_t *)local_2f0,&local_370,&local_398,false);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  clask::server_t::run((server_t *)local_2f0,0x1f90);
  clask::server_t::~server_t((server_t *)local_2f0);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();

  s.GET("/api", [&](clask::request&) {
      nlohmann::json data;
      data["user"][0]["id"] = 1;
      data["user"][0]["name"] = "mattn";
      data["user"][0]["created_at"] = "2020/06/14 00:41:35";
      data["user"][1]["id"] = 2;
      data["user"][1]["name"] = "gopher";
      data["user"][1]["created_at"] = "2020/06/12 15:07:54";
      return data.dump();
  });
  s.static_dir("/", "./public");
  s.run();
}